

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O0

int __thiscall
serial_wiring::UartSerial::_registerSerialEventCallback
          (UartSerial *this,serial_event_t uponBytesAvailable_,void *context_)

{
  bool bVar1;
  UartSerial *local_40;
  code *local_38;
  undefined8 local_30;
  thread local_28;
  void *local_20;
  void *context__local;
  serial_event_t uponBytesAvailable__local;
  UartSerial *this_local;
  
  local_20 = context_;
  context__local = uponBytesAvailable_;
  uponBytesAvailable__local = (serial_event_t)this;
  if (this->_serial_file_descriptor == -1) {
    perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
  }
  else {
    this->_bytesAvailableCallback = uponBytesAvailable_;
    this->_bytes_available_context = context_;
    if ((this->_bytesAvailableCallback != (serial_event_t)0x0) &&
       (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->_polling), !bVar1)) {
      local_38 = pollForSerialData;
      local_30 = 0;
      local_40 = this;
      std::thread::thread<void(serial_wiring::UartSerial::*)(),serial_wiring::UartSerial*,void>
                (&local_28,(type *)&local_38,&local_40);
      std::thread::operator=(&this->_poll_thread,&local_28);
      std::thread::~thread(&local_28);
    }
  }
  return 0;
}

Assistant:

int
UartSerial::_registerSerialEventCallback (
    serial_event_t uponBytesAvailable_,
    void * context_
) {
    if ( -1 == _serial_file_descriptor ) {
        ::perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
    } else {
        _bytesAvailableCallback = uponBytesAvailable_;
        _bytes_available_context = context_;

        if ( _bytesAvailableCallback && !_polling ) {
            _poll_thread = std::thread(&UartSerial::pollForSerialData, this);
        }
    }
    return 0;
}